

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int on_ack_max_stream_data
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  byte *pbVar1;
  size_t sVar2;
  int iVar3;
  quicly_stream_t *stream;
  ulong uVar4;
  
  stream = quicly_get_stream((quicly_conn_t *)&map[-0x28].num_packets,(sent->data).stream.stream_id)
  ;
  if (stream != (quicly_stream_t *)0x0) {
    if (acked == 0) {
      sVar2 = (stream->_send_aux).max_stream_data_sender.num_inflight;
      if (sVar2 == 0) {
        __assert_fail("m->num_inflight != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                      ,0x80,
                      "void quicly_maxsender_lost(quicly_maxsender_t *, quicly_maxsender_sent_t *)")
        ;
      }
      (stream->_send_aux).max_stream_data_sender.num_inflight = sVar2 - 1;
      pbVar1 = (byte *)((long)&sent->data + 8);
      *pbVar1 = *pbVar1 & 0xfe;
      iVar3 = should_send_max_stream_data(stream);
      if (iVar3 != 0) {
        sched_stream_control(stream);
      }
    }
    else {
      uVar4 = (sent->data).ack.range.end;
      if ((stream->_send_aux).max_stream_data_sender.max_acked < (long)(uVar4 >> 1)) {
        (stream->_send_aux).max_stream_data_sender.max_acked = uVar4 >> 1;
        uVar4 = (sent->data).ack.range.end;
      }
      if ((uVar4 & 1) != 0) {
        sVar2 = (stream->_send_aux).max_stream_data_sender.num_inflight;
        if (sVar2 == 0) {
          __assert_fail("m->num_inflight != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                        ,0x77,
                        "void quicly_maxsender_acked(quicly_maxsender_t *, quicly_maxsender_sent_t *)"
                       );
        }
        (stream->_send_aux).max_stream_data_sender.num_inflight = sVar2 - 1;
        pbVar1 = (byte *)((long)&sent->data + 8);
        *pbVar1 = *pbVar1 & 0xfe;
      }
    }
  }
  return 0;
}

Assistant:

static int on_ack_max_stream_data(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_stream_t *stream;

    if ((stream = quicly_get_stream(conn, sent->data.stream.stream_id)) != NULL) {
        if (acked) {
            quicly_maxsender_acked(&stream->_send_aux.max_stream_data_sender, &sent->data.max_stream_data.args);
        } else {
            quicly_maxsender_lost(&stream->_send_aux.max_stream_data_sender, &sent->data.max_stream_data.args);
            if (should_send_max_stream_data(stream))
                sched_stream_control(stream);
        }
    }

    return 0;
}